

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXDocument.cpp
# Opt level: O0

Object * __thiscall Assimp::FBX::LazyObject::Get(LazyObject *this,bool dieOnError)

{
  Token *pTVar1;
  bool bVar2;
  int iVar3;
  pointer pOVar4;
  Token *err_out;
  size_type sVar5;
  const_reference ppTVar6;
  char *pcVar7;
  char *pcVar8;
  char *pcVar9;
  size_t __n;
  MeshGeometry *this_00;
  ShapeGeometry *this_01;
  LineGeometry *this_02;
  CameraSwitcher *this_03;
  Cluster *this_04;
  Skin *this_05;
  BlendShape *this_06;
  BlendShapeChannel *this_07;
  Model *this_08;
  Material *this_09;
  Texture *this_10;
  LayeredTexture *this_11;
  Video *this_12;
  AnimationStack *this_13;
  AnimationLayer *this_14;
  AnimationCurve *this_15;
  AnimationCurveNode *this_16;
  exception *ex;
  size_t length;
  char *obtype;
  string local_180;
  undefined1 local_160 [8];
  string classtag;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  Token *local_c0;
  size_t i;
  string local_b0;
  undefined1 local_90 [8];
  string name;
  char *err;
  string local_50;
  vector<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_> *local_30;
  TokenList *tokens;
  Token *key;
  LazyObject *pLStack_18;
  bool dieOnError_local;
  LazyObject *this_local;
  
  key._7_1_ = dieOnError;
  pLStack_18 = this;
  bVar2 = IsBeingConstructed(this);
  if ((bVar2) || (bVar2 = FailedToConstruct(this), bVar2)) {
    this_local = (LazyObject *)0x0;
  }
  else {
    pOVar4 = std::
             unique_ptr<const_Assimp::FBX::Object,_std::default_delete<const_Assimp::FBX::Object>_>
             ::get(&this->object);
    if (pOVar4 == (pointer)0x0) {
      err_out = Element::KeyToken(this->element);
      tokens = (TokenList *)err_out;
      local_30 = Element::Tokens(this->element);
      sVar5 = std::vector<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>::
              size(local_30);
      if (sVar5 < 3) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_50,"expected at least 3 tokens: id, name and class tag",
                   (allocator *)&stack0xffffffffffffffaf);
        Util::DOMError(&local_50,this->element);
      }
      ppTVar6 = std::vector<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
                ::operator[](local_30,1);
      ParseTokenAsString_abi_cxx11_
                ((string *)local_90,(FBX *)*ppTVar6,(Token *)((long)&name.field_2 + 8),
                 &err_out->sbegin);
      if (name.field_2._8_8_ != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_b0,(char *)name.field_2._8_8_,(allocator *)((long)&i + 7));
        Util::DOMError(&local_b0,this->element);
      }
      ppTVar6 = std::vector<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
                ::operator[](local_30,1);
      bVar2 = Token::IsBinary(*ppTVar6);
      if (bVar2) {
        for (local_c0 = (Token *)0x0; pTVar1 = local_c0,
            err_out = (Token *)std::__cxx11::string::length(), pTVar1 < err_out;
            local_c0 = (Token *)((long)&local_c0->sbegin + 1)) {
          pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)local_90);
          if ((*pcVar7 == '\0') &&
             (pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)local_90), *pcVar7 == '\x01')
             ) {
            std::__cxx11::string::substr((ulong)&local_120,(ulong)local_90);
            std::operator+(&local_100,&local_120,"::");
            std::__cxx11::string::substr((ulong)((long)&classtag.field_2 + 8),(ulong)local_90);
            std::operator+(&local_e0,&local_100,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           ((long)&classtag.field_2 + 8));
            std::__cxx11::string::operator=((string *)local_90,(string *)&local_e0);
            std::__cxx11::string::~string((string *)&local_e0);
            std::__cxx11::string::~string((string *)(classtag.field_2._M_local_buf + 8));
            std::__cxx11::string::~string((string *)&local_100);
            std::__cxx11::string::~string((string *)&local_120);
          }
        }
      }
      ppTVar6 = std::vector<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
                ::operator[](local_30,2);
      ParseTokenAsString_abi_cxx11_
                ((string *)local_160,(FBX *)*ppTVar6,(Token *)((long)&name.field_2 + 8),
                 &err_out->sbegin);
      if (name.field_2._8_8_ != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_180,(char *)name.field_2._8_8_,(allocator *)((long)&obtype + 7))
        ;
        Util::DOMError(&local_180,this->element);
      }
      *(byte *)&this->flags = (byte)this->flags | 1;
      pcVar7 = Token::begin((Token *)tokens);
      pcVar8 = Token::end((Token *)tokens);
      pcVar9 = Token::begin((Token *)tokens);
      __n = (long)pcVar8 - (long)pcVar9;
      iVar3 = strncmp(pcVar7,"Geometry",__n);
      if (iVar3 == 0) {
        pcVar7 = (char *)std::__cxx11::string::c_str();
        iVar3 = strcmp(pcVar7,"Mesh");
        if (iVar3 == 0) {
          this_00 = (MeshGeometry *)operator_new(0x3c8);
          MeshGeometry::MeshGeometry(this_00,this->id,this->element,(string *)local_90,this->doc);
          std::
          unique_ptr<const_Assimp::FBX::Object,_std::default_delete<const_Assimp::FBX::Object>_>::
          reset(&this->object,(pointer)this_00);
        }
        pcVar7 = (char *)std::__cxx11::string::c_str();
        iVar3 = strcmp(pcVar7,"Shape");
        if (iVar3 == 0) {
          this_01 = (ShapeGeometry *)operator_new(0xa0);
          ShapeGeometry::ShapeGeometry(this_01,this->id,this->element,(string *)local_90,this->doc);
          std::
          unique_ptr<const_Assimp::FBX::Object,_std::default_delete<const_Assimp::FBX::Object>_>::
          reset(&this->object,(pointer)this_01);
        }
        pcVar7 = (char *)std::__cxx11::string::c_str();
        iVar3 = strcmp(pcVar7,"Line");
        if (iVar3 == 0) {
          this_02 = (LineGeometry *)operator_new(0x88);
          LineGeometry::LineGeometry(this_02,this->id,this->element,(string *)local_90,this->doc);
          std::
          unique_ptr<const_Assimp::FBX::Object,_std::default_delete<const_Assimp::FBX::Object>_>::
          reset(&this->object,(pointer)this_02);
        }
      }
      else {
        iVar3 = strncmp(pcVar7,"NodeAttribute",__n);
        if (iVar3 == 0) {
          pcVar7 = (char *)std::__cxx11::string::c_str();
          iVar3 = strcmp(pcVar7,"Camera");
          if (iVar3 == 0) {
            pOVar4 = (pointer)operator_new(0x48);
            Camera::Camera((Camera *)pOVar4,this->id,this->element,this->doc,(string *)local_90);
            std::
            unique_ptr<const_Assimp::FBX::Object,_std::default_delete<const_Assimp::FBX::Object>_>::
            reset(&this->object,pOVar4);
          }
          else {
            pcVar7 = (char *)std::__cxx11::string::c_str();
            iVar3 = strcmp(pcVar7,"CameraSwitcher");
            if (iVar3 == 0) {
              this_03 = (CameraSwitcher *)operator_new(0x90);
              CameraSwitcher::CameraSwitcher
                        (this_03,this->id,this->element,this->doc,(string *)local_90);
              std::
              unique_ptr<const_Assimp::FBX::Object,_std::default_delete<const_Assimp::FBX::Object>_>
              ::reset(&this->object,(pointer)this_03);
            }
            else {
              pcVar7 = (char *)std::__cxx11::string::c_str();
              iVar3 = strcmp(pcVar7,"Light");
              if (iVar3 == 0) {
                pOVar4 = (pointer)operator_new(0x48);
                FBX::Light::Light((Light *)pOVar4,this->id,this->element,this->doc,
                                  (string *)local_90);
                std::
                unique_ptr<const_Assimp::FBX::Object,_std::default_delete<const_Assimp::FBX::Object>_>
                ::reset(&this->object,pOVar4);
              }
              else {
                pcVar7 = (char *)std::__cxx11::string::c_str();
                iVar3 = strcmp(pcVar7,"Null");
                if (iVar3 == 0) {
                  pOVar4 = (pointer)operator_new(0x48);
                  Null::Null((Null *)pOVar4,this->id,this->element,this->doc,(string *)local_90);
                  std::
                  unique_ptr<const_Assimp::FBX::Object,_std::default_delete<const_Assimp::FBX::Object>_>
                  ::reset(&this->object,pOVar4);
                }
                else {
                  pcVar7 = (char *)std::__cxx11::string::c_str();
                  iVar3 = strcmp(pcVar7,"LimbNode");
                  if (iVar3 == 0) {
                    pOVar4 = (pointer)operator_new(0x48);
                    LimbNode::LimbNode((LimbNode *)pOVar4,this->id,this->element,this->doc,
                                       (string *)local_90);
                    std::
                    unique_ptr<const_Assimp::FBX::Object,_std::default_delete<const_Assimp::FBX::Object>_>
                    ::reset(&this->object,pOVar4);
                  }
                }
              }
            }
          }
        }
        else {
          iVar3 = strncmp(pcVar7,"Deformer",__n);
          if (iVar3 == 0) {
            pcVar7 = (char *)std::__cxx11::string::c_str();
            iVar3 = strcmp(pcVar7,"Cluster");
            if (iVar3 == 0) {
              this_04 = (Cluster *)operator_new(0x100);
              Cluster::Cluster(this_04,this->id,this->element,this->doc,(string *)local_90);
              std::
              unique_ptr<const_Assimp::FBX::Object,_std::default_delete<const_Assimp::FBX::Object>_>
              ::reset(&this->object,(pointer)this_04);
            }
            else {
              pcVar7 = (char *)std::__cxx11::string::c_str();
              iVar3 = strcmp(pcVar7,"Skin");
              if (iVar3 == 0) {
                this_05 = (Skin *)operator_new(0x68);
                Skin::Skin(this_05,this->id,this->element,this->doc,(string *)local_90);
                std::
                unique_ptr<const_Assimp::FBX::Object,_std::default_delete<const_Assimp::FBX::Object>_>
                ::reset(&this->object,(pointer)this_05);
              }
              else {
                pcVar7 = (char *)std::__cxx11::string::c_str();
                iVar3 = strcmp(pcVar7,"BlendShape");
                if (iVar3 == 0) {
                  this_06 = (BlendShape *)operator_new(0x60);
                  BlendShape::BlendShape
                            (this_06,this->id,this->element,this->doc,(string *)local_90);
                  std::
                  unique_ptr<const_Assimp::FBX::Object,_std::default_delete<const_Assimp::FBX::Object>_>
                  ::reset(&this->object,(pointer)this_06);
                }
                else {
                  pcVar7 = (char *)std::__cxx11::string::c_str();
                  iVar3 = strcmp(pcVar7,"BlendShapeChannel");
                  if (iVar3 == 0) {
                    this_07 = (BlendShapeChannel *)operator_new(0x80);
                    BlendShapeChannel::BlendShapeChannel
                              (this_07,this->id,this->element,this->doc,(string *)local_90);
                    std::
                    unique_ptr<const_Assimp::FBX::Object,_std::default_delete<const_Assimp::FBX::Object>_>
                    ::reset(&this->object,(pointer)this_07);
                  }
                }
              }
            }
          }
          else {
            iVar3 = strncmp(pcVar7,"Model",__n);
            if (iVar3 == 0) {
              pcVar7 = (char *)std::__cxx11::string::c_str();
              iVar3 = strcmp(pcVar7,"IKEffector");
              if (iVar3 != 0) {
                pcVar7 = (char *)std::__cxx11::string::c_str();
                iVar3 = strcmp(pcVar7,"FKEffector");
                if (iVar3 != 0) {
                  this_08 = (Model *)operator_new(0xd0);
                  Model::Model(this_08,this->id,this->element,this->doc,(string *)local_90);
                  std::
                  unique_ptr<const_Assimp::FBX::Object,_std::default_delete<const_Assimp::FBX::Object>_>
                  ::reset(&this->object,(pointer)this_08);
                }
              }
            }
            else {
              iVar3 = strncmp(pcVar7,"Material",__n);
              if (iVar3 == 0) {
                this_09 = (Material *)operator_new(0xd0);
                FBX::Material::Material(this_09,this->id,this->element,this->doc,(string *)local_90)
                ;
                std::
                unique_ptr<const_Assimp::FBX::Object,_std::default_delete<const_Assimp::FBX::Object>_>
                ::reset(&this->object,(pointer)this_09);
              }
              else {
                iVar3 = strncmp(pcVar7,"Texture",__n);
                if (iVar3 == 0) {
                  this_10 = (Texture *)operator_new(0xf0);
                  Texture::Texture(this_10,this->id,this->element,this->doc,(string *)local_90);
                  std::
                  unique_ptr<const_Assimp::FBX::Object,_std::default_delete<const_Assimp::FBX::Object>_>
                  ::reset(&this->object,(pointer)this_10);
                }
                else {
                  iVar3 = strncmp(pcVar7,"LayeredTexture",__n);
                  if (iVar3 == 0) {
                    this_11 = (LayeredTexture *)operator_new(0x58);
                    LayeredTexture::LayeredTexture
                              (this_11,this->id,this->element,this->doc,(string *)local_90);
                    std::
                    unique_ptr<const_Assimp::FBX::Object,_std::default_delete<const_Assimp::FBX::Object>_>
                    ::reset(&this->object,(pointer)this_11);
                  }
                  else {
                    iVar3 = strncmp(pcVar7,"Video",__n);
                    if (iVar3 == 0) {
                      this_12 = (Video *)operator_new(0xb8);
                      Video::Video(this_12,this->id,this->element,this->doc,(string *)local_90);
                      std::
                      unique_ptr<const_Assimp::FBX::Object,_std::default_delete<const_Assimp::FBX::Object>_>
                      ::reset(&this->object,(pointer)this_12);
                    }
                    else {
                      iVar3 = strncmp(pcVar7,"AnimationStack",__n);
                      if (iVar3 == 0) {
                        this_13 = (AnimationStack *)operator_new(0x60);
                        AnimationStack::AnimationStack
                                  (this_13,this->id,this->element,(string *)local_90,this->doc);
                        std::
                        unique_ptr<const_Assimp::FBX::Object,_std::default_delete<const_Assimp::FBX::Object>_>
                        ::reset(&this->object,(pointer)this_13);
                      }
                      else {
                        iVar3 = strncmp(pcVar7,"AnimationLayer",__n);
                        if (iVar3 == 0) {
                          this_14 = (AnimationLayer *)operator_new(0x50);
                          AnimationLayer::AnimationLayer
                                    (this_14,this->id,this->element,(string *)local_90,this->doc);
                          std::
                          unique_ptr<const_Assimp::FBX::Object,_std::default_delete<const_Assimp::FBX::Object>_>
                          ::reset(&this->object,(pointer)this_14);
                        }
                        else {
                          iVar3 = strncmp(pcVar7,"AnimationCurve",__n);
                          if (iVar3 == 0) {
                            this_15 = (AnimationCurve *)operator_new(0x98);
                            AnimationCurve::AnimationCurve
                                      (this_15,this->id,this->element,(string *)local_90,this->doc);
                            std::
                            unique_ptr<const_Assimp::FBX::Object,_std::default_delete<const_Assimp::FBX::Object>_>
                            ::reset(&this->object,(pointer)this_15);
                          }
                          else {
                            iVar3 = strncmp(pcVar7,"AnimationCurveNode",__n);
                            if (iVar3 == 0) {
                              this_16 = (AnimationCurveNode *)operator_new(0xa8);
                              AnimationCurveNode::AnimationCurveNode
                                        (this_16,this->id,this->element,(string *)local_90,this->doc
                                         ,(char **)0x0,0);
                              std::
                              unique_ptr<const_Assimp::FBX::Object,_std::default_delete<const_Assimp::FBX::Object>_>
                              ::reset(&this->object,(pointer)this_16);
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
      std::unique_ptr<const_Assimp::FBX::Object,_std::default_delete<const_Assimp::FBX::Object>_>::
      get(&this->object);
      this->flags = this->flags & 0xfffffffe;
      this_local = (LazyObject *)
                   std::
                   unique_ptr<const_Assimp::FBX::Object,_std::default_delete<const_Assimp::FBX::Object>_>
                   ::get(&this->object);
      std::__cxx11::string::~string((string *)local_160);
      std::__cxx11::string::~string((string *)local_90);
    }
    else {
      this_local = (LazyObject *)
                   std::
                   unique_ptr<const_Assimp::FBX::Object,_std::default_delete<const_Assimp::FBX::Object>_>
                   ::get(&this->object);
    }
  }
  return (Object *)this_local;
}

Assistant:

const Object* LazyObject::Get(bool dieOnError)
{
    if(IsBeingConstructed() || FailedToConstruct()) {
        return nullptr;
    }

    if (object.get()) {
        return object.get();
    }

    const Token& key = element.KeyToken();
    const TokenList& tokens = element.Tokens();

    if(tokens.size() < 3) {
        DOMError("expected at least 3 tokens: id, name and class tag",&element);
    }

    const char* err;
    std::string name = ParseTokenAsString(*tokens[1],err);
    if (err) {
        DOMError(err,&element);
    }

    // small fix for binary reading: binary fbx files don't use
    // prefixes such as Model:: in front of their names. The
    // loading code expects this at many places, though!
    // so convert the binary representation (a 0x0001) to the
    // double colon notation.
    if(tokens[1]->IsBinary()) {
        for (size_t i = 0; i < name.length(); ++i) {
            if (name[i] == 0x0 && name[i+1] == 0x1) {
                name = name.substr(i+2) + "::" + name.substr(0,i);
            }
        }
    }

    const std::string classtag = ParseTokenAsString(*tokens[2],err);
    if (err) {
        DOMError(err,&element);
    }

    // prevent recursive calls
    flags |= BEING_CONSTRUCTED;

    try {
        // this needs to be relatively fast since it happens a lot,
        // so avoid constructing strings all the time.
        const char* obtype = key.begin();
        const size_t length = static_cast<size_t>(key.end()-key.begin());

        // For debugging
        //dumpObjectClassInfo( objtype, classtag );

        if (!strncmp(obtype,"Geometry",length)) {
            if (!strcmp(classtag.c_str(),"Mesh")) {
                object.reset(new MeshGeometry(id,element,name,doc));
            }
            if (!strcmp(classtag.c_str(), "Shape")) {
                object.reset(new ShapeGeometry(id, element, name, doc));
            }
            if (!strcmp(classtag.c_str(), "Line")) {
                object.reset(new LineGeometry(id, element, name, doc));
            }
        }
        else if (!strncmp(obtype,"NodeAttribute",length)) {
            if (!strcmp(classtag.c_str(),"Camera")) {
                object.reset(new Camera(id,element,doc,name));
            }
            else if (!strcmp(classtag.c_str(),"CameraSwitcher")) {
                object.reset(new CameraSwitcher(id,element,doc,name));
            }
            else if (!strcmp(classtag.c_str(),"Light")) {
                object.reset(new Light(id,element,doc,name));
            }
            else if (!strcmp(classtag.c_str(),"Null")) {
                object.reset(new Null(id,element,doc,name));
            }
            else if (!strcmp(classtag.c_str(),"LimbNode")) {
                object.reset(new LimbNode(id,element,doc,name));
            }
        }
        else if (!strncmp(obtype,"Deformer",length)) {
            if (!strcmp(classtag.c_str(),"Cluster")) {
                object.reset(new Cluster(id,element,doc,name));
            }
            else if (!strcmp(classtag.c_str(),"Skin")) {
                object.reset(new Skin(id,element,doc,name));
            }
            else if (!strcmp(classtag.c_str(), "BlendShape")) {
                object.reset(new BlendShape(id, element, doc, name));
            }
            else if (!strcmp(classtag.c_str(), "BlendShapeChannel")) {
                object.reset(new BlendShapeChannel(id, element, doc, name));
            }
        }
        else if ( !strncmp( obtype, "Model", length ) ) {
            // FK and IK effectors are not supported
            if ( strcmp( classtag.c_str(), "IKEffector" ) && strcmp( classtag.c_str(), "FKEffector" ) ) {
                object.reset( new Model( id, element, doc, name ) );
            }
        }
        else if (!strncmp(obtype,"Material",length)) {
            object.reset(new Material(id,element,doc,name));
        }
        else if (!strncmp(obtype,"Texture",length)) {
            object.reset(new Texture(id,element,doc,name));
        }
        else if (!strncmp(obtype,"LayeredTexture",length)) {
            object.reset(new LayeredTexture(id,element,doc,name));
        }
        else if (!strncmp(obtype,"Video",length)) {
            object.reset(new Video(id,element,doc,name));
        }
        else if (!strncmp(obtype,"AnimationStack",length)) {
            object.reset(new AnimationStack(id,element,name,doc));
        }
        else if (!strncmp(obtype,"AnimationLayer",length)) {
            object.reset(new AnimationLayer(id,element,name,doc));
        }
        // note: order matters for these two
        else if (!strncmp(obtype,"AnimationCurve",length)) {
            object.reset(new AnimationCurve(id,element,name,doc));
        }
        else if (!strncmp(obtype,"AnimationCurveNode",length)) {
            object.reset(new AnimationCurveNode(id,element,name,doc));
        }
    }
    catch(std::exception& ex) {
        flags &= ~BEING_CONSTRUCTED;
        flags |= FAILED_TO_CONSTRUCT;

        if(dieOnError || doc.Settings().strictMode) {
            throw;
        }

        // note: the error message is already formatted, so raw logging is ok
        if(!DefaultLogger::isNullLogger()) {
            ASSIMP_LOG_ERROR(ex.what());
        }
        return NULL;
    }

    if (!object.get()) {
        //DOMError("failed to convert element to DOM object, class: " + classtag + ", name: " + name,&element);
    }

    flags &= ~BEING_CONSTRUCTED;
    return object.get();
}